

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::ChannelList>::TypedAttribute
          (TypedAttribute<Imf_2_5::ChannelList> *this)

{
  Attribute *in_RDI;
  
  Attribute::Attribute(in_RDI);
  in_RDI->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_0374ac40;
  ChannelList::ChannelList((ChannelList *)0xa42924);
  return;
}

Assistant:

TypedAttribute () = default;